

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

void Sfm_NtkUpdateLevel_rec(Sfm_Ntk_t *p,int iNode)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vArray;
  int LevelNew;
  int iFanout;
  int i;
  int iNode_local;
  Sfm_Ntk_t *p_local;
  
  vArray = Sfm_ObjFiArray(p,iNode);
  iVar1 = Sfm_ObjAddsLevel(p,iNode);
  iVar1 = Sfm_ObjLevelNew(vArray,&p->vLevels,iVar1);
  iVar2 = Sfm_ObjLevel(p,iNode);
  if (iVar1 != iVar2) {
    Sfm_ObjSetLevel(p,iNode,iVar1);
    for (LevelNew = 0; iVar1 = Sfm_ObjFanoutNum(p,iNode), LevelNew < iVar1; LevelNew = LevelNew + 1)
    {
      iVar1 = Sfm_ObjFanout(p,iNode,LevelNew);
      Sfm_NtkUpdateLevel_rec(p,iVar1);
    }
  }
  return;
}

Assistant:

void Sfm_NtkUpdateLevel_rec( Sfm_Ntk_t * p, int iNode )
{
    int i, iFanout;
    int LevelNew = Sfm_ObjLevelNew( Sfm_ObjFiArray(p, iNode), &p->vLevels, Sfm_ObjAddsLevel(p, iNode) );
    if ( LevelNew == Sfm_ObjLevel(p, iNode) )
        return;
    Sfm_ObjSetLevel( p, iNode, LevelNew );
    Sfm_ObjForEachFanout( p, iNode, iFanout, i )
        Sfm_NtkUpdateLevel_rec( p, iFanout );
}